

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

boolean bad_rock(permonst *mdat,boolean is_player,xchar x,xchar y)

{
  char cVar1;
  obj *poVar2;
  
  if ((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
     (poVar2 = sobj_at(0x214,level,(int)x,(int)y), poVar2 != (obj *)0x0)) {
    return '\x01';
  }
  cVar1 = level->locations[x][y].typ;
  if ('\x10' < cVar1) {
    return '\0';
  }
  if ((mdat->mflags1 & 0x60) == 0x20) {
    if ('\x0e' < cVar1) {
      return '\0';
    }
    if ((level->locations[x][y].field_0x6 & 0x80) == 0) {
      return '\0';
    }
  }
  else if ('\x0e' < cVar1) goto LAB_001a32d8;
  if ((level->locations[x][y].field_0x7 & 1) != 0) {
    return '\x01';
  }
LAB_001a32d8:
  if ((mdat->mflags1 & 8) == 0) {
    if (is_player == '\0') {
      return '\x01';
    }
    if (u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) {
      return ((youmonst.data)->mflags1 & 8) == 0;
    }
  }
  return '\0';
}

Assistant:

boolean bad_rock(const struct permonst *mdat, boolean is_player, xchar x, xchar y)
{
	return (boolean) ((In_sokoban(&u.uz) && sobj_at(BOULDER, level, x,y)) ||
	       (IS_ROCK(level->locations[x][y].typ)
		    && (!tunnels(mdat) || needspick(mdat) || !may_dig(level, x,y))
		    && !(may_passwall(level, x,y)
			&& (passes_walls(mdat) || (is_player && Passes_walls)))));
}